

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set.hpp
# Opt level: O2

int __thiscall
Lib::Set<Kernel::Clause_*,_Lib::DefaultHash>::remove
          (Set<Kernel::Clause_*,_Lib::DefaultHash> *this,char *__filename)

{
  uint uVar1;
  type tVar2;
  ulong uVar3;
  Cell *pCVar4;
  
  tVar2 = DefaultHash::hash<Kernel::Clause>((Clause *)__filename);
  uVar3 = 2;
  if (2 < tVar2) {
    uVar3 = (ulong)tVar2;
  }
  pCVar4 = this->_entries + uVar3 % (ulong)(uint)this->_capacity;
  do {
    uVar1 = pCVar4->code;
    if (uVar1 == 0) {
LAB_00501b68:
      return CONCAT31((int3)(uVar1 >> 8),uVar1 != 0);
    }
    if ((uVar1 == (uint)uVar3) && (pCVar4->value == (Clause *)__filename)) {
      pCVar4->code = 1;
      this->_size = this->_size - 1;
      goto LAB_00501b68;
    }
    pCVar4 = pCVar4 + 1;
    if (pCVar4 == this->_afterLast) {
      pCVar4 = this->_entries;
    }
  } while( true );
}

Assistant:

bool remove(const Val val)
  {
    unsigned code = Hash::hash(val);
    if (code < 2) {
      code = 2;
    }

    Cell* cell = firstCellForCode(code);
    while (! cell->empty()) {
      if (cell->deleted()) {
	cell = nextCell(cell);
	continue;
      }
      if (cell->code == code &&
	  Hash::equals(cell->value,val)) {
	cell->code = 1; // deleted
	_size--;
	return true;
      }
      cell = nextCell(cell);
    }
    return false;
  }